

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::Increment_Full(Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  double value;
  
  if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
      bVar2 = VarIs<Js::JavascriptBigInt>(aRight);
      if (bVar2) {
        pvVar4 = JavascriptBigInt::Increment(aRight);
        return pvVar4;
      }
      value = Increment_Helper(aRight,scriptContext);
      pvVar4 = JavascriptNumber::ToVarIntCheck(value,scriptContext);
      return pvVar4;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pvVar4 = TaggedInt::Increment(aRight,scriptContext);
  return pvVar4;
}

Assistant:

Var JavascriptMath::Increment_Full(Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Increment_Full);
            if (TaggedInt::Is(aRight))
            {
                return TaggedInt::Increment(aRight, scriptContext);
            }
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Increment(aRight);
            }

            double inc = Increment_Helper(aRight, scriptContext);
            return JavascriptNumber::ToVarIntCheck(inc, scriptContext);
            JIT_HELPER_END(Op_Increment_Full);
        }